

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O1

void __thiscall
soplex::VectorBase<double>::VectorBase(VectorBase<double> *this,int dimen,double *p_val)

{
  (this->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)this,p_val,p_val + dimen);
  return;
}

Assistant:

VectorBase(int dimen, R* p_val)
   {
      val.assign(p_val, p_val + dimen);
   }